

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::dump(Dictionary *this,ostream *out)

{
  bool bVar1;
  size_type sVar2;
  void *this_00;
  ostream *poVar3;
  ostream *in_RSI;
  long in_RDI;
  string entryType;
  entry it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *__range1;
  ostream *in_stack_ffffffffffffff18;
  entry *in_stack_ffffffffffffff20;
  entry *in_stack_ffffffffffffff28;
  entry *in_stack_ffffffffffffff30;
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  long local_50;
  char local_48;
  entry *local_28;
  __normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  local_20;
  long local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  sVar2 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::size
                    ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28));
  this_00 = (void *)std::ostream::operator<<(in_RSI,sVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_18 = in_RDI + 0x28;
  local_20._M_current =
       (entry *)std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::begin
                          ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                           in_stack_ffffffffffffff18);
  local_28 = (entry *)std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end
                                ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)
                                 in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
    ::operator*(&local_20);
    entry::entry(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"word",&local_91);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    if (local_48 == '\x01') {
      std::__cxx11::string::operator=(local_90,"label");
    }
    poVar3 = std::operator<<(local_10,local_70);
    in_stack_ffffffffffffff30 = (entry *)std::operator<<(poVar3," ");
    in_stack_ffffffffffffff28 =
         (entry *)std::ostream::operator<<(in_stack_ffffffffffffff30,local_50);
    in_stack_ffffffffffffff20 = (entry *)std::operator<<((ostream *)in_stack_ffffffffffffff28," ");
    in_stack_ffffffffffffff18 = std::operator<<((ostream *)in_stack_ffffffffffffff20,local_90);
    std::ostream::operator<<(in_stack_ffffffffffffff18,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_90);
    entry::~entry(in_stack_ffffffffffffff20);
    __gnu_cxx::
    __normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Dictionary::dump(std::ostream& out) const {
  out << words_.size() << std::endl;
  for (auto it : words_) {
    std::string entryType = "word";
    if (it.type == entry_type::label) {
      entryType = "label";
    }
    out << it.word << " " << it.count << " " << entryType << std::endl;
  }
}